

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void bgr_555_to_abgr_f32(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy
                        ,int width,int height)

{
  undefined8 *puVar1;
  int in_ECX;
  long in_RDX;
  ALLEGRO_COLOR AVar2;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  ALLEGRO_COLOR *dst_end;
  int dst_gap;
  int src_gap;
  ALLEGRO_COLOR *dst_ptr;
  uint16_t *src_ptr;
  int y;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 *local_38;
  int local_28;
  
  local_38 = (undefined8 *)(in_RDX + in_stack_00000010 * in_ECX + (long)in_stack_00000008 * 0x10);
  for (local_28 = 0; local_28 < (int)dst_end; local_28 = local_28 + 1) {
    puVar1 = local_38 + (long)in_stack_00000018 * 2;
    for (; local_38 < puVar1; local_38 = local_38 + 2) {
      AVar2 = al_map_rgb('\0','\0','\0');
      local_58 = AVar2._0_8_;
      *local_38 = local_58;
      local_50 = AVar2._8_8_;
      local_38[1] = local_50;
    }
    local_38 = local_38 + (long)(in_ECX / 0x10 - in_stack_00000018) * 2;
  }
  return;
}

Assistant:

static void bgr_555_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_BGR_555_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}